

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void tcp_pinger_v6_new(int vectored_writes)

{
  int iVar1;
  uint32_t *puVar2;
  undefined8 uVar3;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  pinger_t *pinger;
  sockaddr_in6 server_addr;
  int r;
  int vectored_writes_local;
  
  server_addr.sin6_scope_id = vectored_writes;
  iVar1 = uv_ip6_addr("::1",0x23a3,(long)&pinger + 4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xdd,"uv_ip6_addr(\"::1\", 9123, &server_addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = (uint32_t *)malloc(0x168);
  if (puVar2 == (uint32_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xdf,"pinger","!=","NULL",0,"!=",0);
    abort();
  }
  *puVar2 = server_addr.sin6_scope_id;
  puVar2[2] = 0;
  puVar2[1] = 0;
  *(char **)(puVar2 + 0x58) = PING;
  uVar3 = uv_default_loop();
  server_addr.sin6_addr.__in6_u.__u6_addr32[3] = uv_tcp_init(uVar3,puVar2 + 4);
  *(uint32_t **)(puVar2 + 4) = puVar2;
  if ((long)(int)server_addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xe8,"r","==","0",(long)(int)server_addr.sin6_addr.__in6_u.__u6_addr32[3],"==",0);
    abort();
  }
  server_addr.sin6_addr.__in6_u.__u6_addr32[3] =
       uv_tcp_connect(puVar2 + 0x3e,puVar2 + 4,(long)&pinger + 4,pinger_on_connect);
  if ((long)(int)server_addr.sin6_addr.__in6_u.__u6_addr32[3] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xf0,"r","==","0",(long)(int)server_addr.sin6_addr.__in6_u.__u6_addr32[3],"==",0);
    abort();
  }
  if ((long)pinger_on_connect_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xf3,"pinger_on_connect_count","==","0",(long)pinger_on_connect_count,"==",0);
    abort();
  }
  return;
}

Assistant:

static void tcp_pinger_v6_new(int vectored_writes) {
  int r;
  struct sockaddr_in6 server_addr;
  pinger_t* pinger;


  ASSERT_OK(uv_ip6_addr("::1", TEST_PORT, &server_addr));
  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &pinger->stream.tcp);
  pinger->stream.tcp.data = pinger;
  ASSERT_OK(r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  r = uv_tcp_connect(&pinger->connect_req,
                     &pinger->stream.tcp,
                     (const struct sockaddr*) &server_addr,
                     pinger_on_connect);
  ASSERT_OK(r);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT_OK(pinger_on_connect_count);
}